

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_>
MCTS::compute_tree<TestGame>(TestGame root_state,ComputeOptions options,result_type initial_seed)

{
  Node<TestGame> *pNVar1;
  Node<TestGame> *this;
  runtime_error *this_00;
  ulong in_RCX;
  long lVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_> *root;
  mt19937_64 random_engine;
  Move local_a1c;
  TestGame local_a18;
  TestGame local_a08;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  iVar3 = root_state.X;
  local_a18._0_8_ = CONCAT44((int)((ulong)register0x00000030 >> 0x20),iVar3);
  local_a18.X = (int)initial_seed;
  lVar2 = 1;
  do {
    in_RCX = (in_RCX >> 0x3e ^ in_RCX) * 0x5851f42d4c957f2d + lVar2;
    local_9f8._M_x[lVar2] = in_RCX;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_9f8._M_p = 0x138;
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < iVar3 - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  pNVar1 = (Node<TestGame> *)operator_new(0x60);
  pNVar1->move = -1;
  pNVar1->parent = (Node<TestGame> *)0x0;
  pNVar1->player_to_move = iVar3;
  pNVar1->wins = 0.0;
  pNVar1->visits = 0;
  TestGame::get_moves(&pNVar1->moves,&local_a18);
  (pNVar1->children).
  super__Vector_base<MCTS::Node<TestGame>_*,_std::allocator<MCTS::Node<TestGame>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1->UCT_score = 0.0;
  (pNVar1->children).
  super__Vector_base<MCTS::Node<TestGame>_*,_std::allocator<MCTS::Node<TestGame>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar1->children).
  super__Vector_base<MCTS::Node<TestGame>_*,_std::allocator<MCTS::Node<TestGame>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(Node<TestGame> **)root_state._0_8_ = pNVar1;
  if (options.max_iterations != 0) {
    iVar3 = 1;
    do {
      local_a08.X = local_a18.X;
      local_a08.player_to_move = local_a18.player_to_move;
      local_a08.winner = local_a18.winner;
      this = pNVar1;
      while ((this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        if ((this->children).
            super__Vector_base<MCTS::Node<TestGame>_*,_std::allocator<MCTS::Node<TestGame>_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->children).
            super__Vector_base<MCTS::Node<TestGame>_*,_std::allocator<MCTS::Node<TestGame>_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00147fcb;
        this = Node<TestGame>::select_child_UCT(this);
        TestGame::do_move(&local_a08,this->move);
      }
      local_a1c = Node<TestGame>::
                  get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            (this,&local_9f8);
      TestGame::do_move(&local_a08,local_a1c);
      this = Node<TestGame>::add_child(this,&local_a1c,&local_a08);
LAB_00147fcb:
      while ((long)local_a08._0_8_ < 0) {
        TestGame::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  (&local_a08,&local_9f8);
      }
      for (; this != (Node<TestGame> *)0x0; this = this->parent) {
        dVar5 = 0.0;
        if (local_a08.winner != this->player_to_move) {
          dVar5 = 1.0;
        }
        dVar6 = 0.5;
        if (local_a08.winner != 0) {
          dVar6 = dVar5;
        }
        this->visits = this->visits + 1;
        this->wins = dVar6 + this->wins;
      }
      bVar4 = iVar3 != options.max_iterations;
      iVar3 = iVar3 + 1;
    } while (bVar4);
  }
  return (__uniq_ptr_data<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>,_true,_true>
          )(tuple<MCTS::Node<TestGame>_*,_std::default_delete<MCTS::Node<TestGame>_>_>)
           root_state._0_8_;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}